

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O1

void Gia_ManPrintEquivs(Gia_Man_t *p)

{
  uint uVar1;
  long lVar2;
  ulong uVar3;
  
  printf("Const0:");
  if (0 < p->nObjs) {
    lVar2 = 0;
    uVar3 = 0;
    do {
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      uVar1 = *(uint *)(&p->pObjs->field_0x0 + lVar2);
      if (((~uVar1 & 0x1fffffff) != 0 && -1 < (int)uVar1) &&
         (((uint)p->pReprs[uVar3] & 0xfffffff) == 0)) {
        printf(" %d",uVar3 & 0xffffffff);
      }
      uVar3 = uVar3 + 1;
      lVar2 = lVar2 + 0xc;
    } while ((long)uVar3 < (long)p->nObjs);
  }
  putchar(10);
  if (1 < p->nObjs) {
    uVar3 = 1;
    do {
      if (((~(uint)p->pReprs[uVar3] & 0xfffffff) == 0) && (0 < p->pNexts[uVar3])) {
        printf("%d:",uVar3 & 0xffffffff);
        if (((~(uint)p->pReprs[uVar3] & 0xfffffff) != 0) || (p->pNexts[uVar3] < 1)) {
          __assert_fail("Gia_ObjIsHead(p, i)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaDup.c"
                        ,0x12ba,"void Gia_ManPrintEquivs(Gia_Man_t *)");
        }
        for (uVar1 = p->pNexts[uVar3]; 0 < (int)uVar1; uVar1 = p->pNexts[uVar1]) {
          printf(" %d",(ulong)uVar1);
        }
        putchar(10);
      }
      uVar3 = uVar3 + 1;
    } while ((long)uVar3 < (long)p->nObjs);
  }
  return;
}

Assistant:

void Gia_ManPrintEquivs( Gia_Man_t * p )
{
    Gia_Obj_t * pObj; int i, iObj;
    printf( "Const0:" );
    Gia_ManForEachAnd( p, pObj, i )
        if ( Gia_ObjRepr(p, i) == 0 )
            printf( " %d", i );
    printf( "\n" );
    Gia_ManForEachClass( p, i )
    {
        printf( "%d:", i );
        Gia_ClassForEachObj1( p, i, iObj )
            printf( " %d", iObj );
        printf( "\n" );
    }
}